

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t prefix_w(wchar_t *start,wchar_t *end,wchar_t *test)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  wVar2 = L'\0';
  if ((start != end) && (*start == *test)) {
    pwVar4 = start + 1;
    pwVar3 = test + 1;
    do {
      if (end <= pwVar4) break;
      wVar1 = *pwVar4;
      pwVar4 = pwVar4 + 1;
      wVar2 = *pwVar3;
      pwVar3 = pwVar3 + 1;
    } while (wVar1 == wVar2);
    wVar2 = (wchar_t)(end <= pwVar4);
  }
  return wVar2;
}

Assistant:

static int
prefix_w(const wchar_t *start, const wchar_t *end, const wchar_t *test)
{
	if (start == end)
		return (0);

	if (*start++ != *test++)
		return (0);

	while (start < end  &&  *start++ == *test++)
		;

	if (start < end)
		return (0);

	return (1);
}